

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O1

Log __thiscall Log::addStringStream<unsigned_int>(Log *this,uint t)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined4 in_register_00000034;
  Log LVar2;
  string string;
  ostringstream str;
  undefined1 *local_1b8;
  uint local_1b0;
  undefined1 local_1a8 [16];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  if ((((Log *)CONCAT44(in_register_00000034,t))->mData).
      super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    Log(this,(Log *)CONCAT44(in_register_00000034,t));
    _Var1._M_pi = extraout_RDX_00;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__cxx11::stringbuf::str();
    write(this,t,local_1b8,(ulong)local_1b0);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8);
    }
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::ios_base::~ios_base(local_128);
    _Var1._M_pi = extraout_RDX;
  }
  LVar2.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  LVar2.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Log)LVar2.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Log addStringStream(T t)
    {
        if (mData) {
            std::ostringstream str;
            str << t;
            const std::string string = str.str();
            return write(string.data(), string.size());
        }
        return *this;
    }